

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessmanager.cpp
# Opt level: O0

void __thiscall
QNetworkAccessManager::connectToHost(QNetworkAccessManager *this,QString *hostName,quint16 port)

{
  QLatin1StringView latin1;
  undefined2 in_DX;
  ParsingMode in_ESI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar1;
  QNetworkRequest request;
  QUrl url;
  size_t in_stack_ffffffffffffff80;
  QNetworkRequest *this_00;
  QNetworkRequest *request_00;
  undefined6 in_stack_ffffffffffffffb8;
  QNetworkRequest local_28 [3];
  QUrl local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  request_00 = (QNetworkRequest *)0xaaaaaaaaaaaaaaaa;
  local_10.d = (QUrlPrivate *)0xaaaaaaaaaaaaaaaa;
  QUrl::QUrl(&local_10);
  QUrl::setHost((QString *)&local_10,in_ESI);
  QUrl::setPort((int)&local_10);
  QVar1 = Qt::Literals::StringLiterals::operator____L1((char *)request_00,in_stack_ffffffffffffff80)
  ;
  this_00 = local_28;
  latin1.m_data._0_6_ = in_stack_ffffffffffffffb8;
  latin1.m_size = (qsizetype)QVar1.m_data;
  latin1.m_data._6_2_ = in_DX;
  QString::QString(in_RDI,latin1);
  QUrl::setScheme((QString *)&local_10);
  QString::~QString((QString *)0x19cabb);
  QNetworkRequest::QNetworkRequest((QNetworkRequest *)in_RDI,(QUrl *)request_00);
  get((QNetworkAccessManager *)in_RDI,request_00);
  QNetworkRequest::~QNetworkRequest(this_00);
  QUrl::~QUrl(&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkAccessManager::connectToHost(const QString &hostName, quint16 port)
{
    QUrl url;
    url.setHost(hostName);
    url.setPort(port);
    url.setScheme("preconnect-http"_L1);
    QNetworkRequest request(url);
    get(request);
}